

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

nn_optset * nn_ipc_optset(void)

{
  nn_optset *pnVar1;
  
  pnVar1 = (nn_optset *)nn_alloc_(0x18);
  if (pnVar1 != (nn_optset *)0x0) {
    pnVar1->vfptr = &nn_ipc_optset_vfptr;
    pnVar1[1].vfptr = (nn_optset_vfptr *)0x0;
    pnVar1[2].vfptr = (nn_optset_vfptr *)0x100000001000;
    return pnVar1;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/ipc.c"
          ,0x60);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static struct nn_optset *nn_ipc_optset ()
{
    struct nn_ipc_optset *optset;

    optset = nn_alloc (sizeof (struct nn_ipc_optset), "optset (ipc)");
    alloc_assert (optset);
    optset->base.vfptr = &nn_ipc_optset_vfptr;

    /*  Default values for the IPC options */
    optset->sec_attr = NULL;
    optset->outbuffersz = 4096;
    optset->inbuffersz = 4096;

    return &optset->base;   
}